

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NodeCompareLevelsDecrease(Abc_Obj_t **pp1,Abc_Obj_t **pp2)

{
  uint uVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  int Diff;
  Abc_Obj_t **pp2_local;
  Abc_Obj_t **pp1_local;
  
  pAVar3 = Abc_ObjRegular(*pp1);
  uVar1 = *(uint *)&pAVar3->field_0x14;
  pAVar3 = Abc_ObjRegular(*pp2);
  iVar2 = (uVar1 >> 0xc) - (*(uint *)&pAVar3->field_0x14 >> 0xc);
  if (iVar2 < 1) {
    if (iVar2 < 0) {
      pp1_local._4_4_ = 1;
    }
    else {
      pAVar3 = Abc_ObjRegular(*pp1);
      iVar2 = pAVar3->Id;
      pAVar3 = Abc_ObjRegular(*pp2);
      iVar2 = iVar2 - pAVar3->Id;
      if (iVar2 < 1) {
        if (iVar2 < 0) {
          pp1_local._4_4_ = 1;
        }
        else {
          pp1_local._4_4_ = 0;
        }
      }
      else {
        pp1_local._4_4_ = -1;
      }
    }
  }
  else {
    pp1_local._4_4_ = -1;
  }
  return pp1_local._4_4_;
}

Assistant:

int Abc_NodeCompareLevelsDecrease( Abc_Obj_t ** pp1, Abc_Obj_t ** pp2 )
{
    int Diff = Abc_ObjRegular(*pp1)->Level - Abc_ObjRegular(*pp2)->Level;
    if ( Diff > 0 )
        return -1;
    if ( Diff < 0 ) 
        return 1;
    Diff = Abc_ObjRegular(*pp1)->Id - Abc_ObjRegular(*pp2)->Id;
    if ( Diff > 0 )
        return -1;
    if ( Diff < 0 ) 
        return 1;
    return 0; 
}